

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin.c
# Opt level: O0

_Bool bin_update_shard_size(uint *bin_shard_sizes,size_t start_size,size_t end_size,size_t nshards)

{
  szind_t sVar1;
  ulong in_RCX;
  ulong in_RSI;
  long in_RDI;
  uint i;
  szind_t ind2;
  szind_t ind1;
  uint local_34;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var2;
  
  if ((in_RCX < 0x41) && (in_RCX != 0)) {
    if (in_RSI < 0x3801) {
      local_34 = sz_size2index_compute
                           (CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      sVar1 = sz_size2index_compute(CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      for (; local_34 <= sVar1; local_34 = local_34 + 1) {
        *(int *)(in_RDI + (ulong)local_34 * 4) = (int)in_RCX;
      }
      _Var2 = false;
    }
    else {
      _Var2 = false;
    }
  }
  else {
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool
bin_update_shard_size(unsigned bin_shard_sizes[SC_NBINS], size_t start_size,
    size_t end_size, size_t nshards) {
	if (nshards > BIN_SHARDS_MAX || nshards == 0) {
		return true;
	}

	if (start_size > SC_SMALL_MAXCLASS) {
		return false;
	}
	if (end_size > SC_SMALL_MAXCLASS) {
		end_size = SC_SMALL_MAXCLASS;
	}

	/* Compute the index since this may happen before sz init. */
	szind_t ind1 = sz_size2index_compute(start_size);
	szind_t ind2 = sz_size2index_compute(end_size);
	for (unsigned i = ind1; i <= ind2; i++) {
		bin_shard_sizes[i] = (unsigned)nshards;
	}

	return false;
}